

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

bool __thiscall CScript::HasValidOps(CScript *this)

{
  const_iterator cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  CScript *pCVar5;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> item;
  opcodetype opcode;
  const_iterator it;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  opcodetype local_44;
  const_iterator local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (this->super_CScriptBase)._size;
  pCVar5 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  local_40.ptr = (uchar *)pCVar5;
  if (uVar3 < 0x1d) {
    local_40.ptr = (uchar *)this;
  }
  while( true ) {
    cVar1.ptr = local_40.ptr;
    uVar4 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar4 = uVar3;
    }
    if (uVar3 < 0x1d) {
      pCVar5 = this;
    }
    pCVar5 = (CScript *)((pCVar5->super_CScriptBase)._union.direct + (int)uVar4);
    if (pCVar5 <= local_40.ptr) goto LAB_0039517f;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = GetOp(this,&local_40,&local_44,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
    if ((!bVar2 || OP_NOP10 < local_44) ||
       (0x208 < (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68._M_impl.super__Vector_impl_data._M_start))) break;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
    uVar3 = (this->super_CScriptBase)._size;
    pCVar5 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
LAB_0039517f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar5 <= cVar1.ptr;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::HasValidOps() const
{
    CScript::const_iterator it = begin();
    while (it < end()) {
        opcodetype opcode;
        std::vector<unsigned char> item;
        if (!GetOp(it, opcode, item) || opcode > MAX_OPCODE || item.size() > MAX_SCRIPT_ELEMENT_SIZE) {
            return false;
        }
    }
    return true;
}